

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SF_DCTDecode.hh
# Opt level: O2

shared_ptr<QPDFStreamFilter> SF_DCTDecode::factory(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<QPDFStreamFilter> sVar2;
  _func_int **local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  std::make_shared<SF_DCTDecode>();
  _Var1._M_pi = _Stack_10._M_pi;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  in_RDI->_vptr_QPDFStreamFilter = local_18;
  in_RDI[1]._vptr_QPDFStreamFilter = (_func_int **)_Var1._M_pi;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10);
  sVar2.super___shared_ptr<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<QPDFStreamFilter>)
         sVar2.super___shared_ptr<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<QPDFStreamFilter>
    factory()
    {
        return std::make_shared<SF_DCTDecode>();
    }